

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O0

ggml_tensor *
ggml_conv_2d(ggml_context *ctx,ggml_tensor *a,ggml_tensor *b,int s0,int s1,int p0,int p1,int d0,
            int d1)

{
  ggml_tensor *pgVar1;
  ggml_tensor *ctx_00;
  ggml_tensor *ne0;
  ggml_tensor *pgVar2;
  undefined4 *in_RSI;
  ggml_tensor *in_RDI;
  undefined4 in_R9D;
  _Bool unaff_retaddr;
  int unaff_retaddr_00;
  int in_stack_00000008;
  int in_stack_0000000c;
  undefined4 in_stack_00000010;
  undefined4 in_stack_00000014;
  undefined4 in_stack_00000018;
  undefined4 in_stack_0000001c;
  ggml_context *in_stack_00000020;
  int in_stack_00000030;
  int in_stack_00000038;
  int in_stack_00000040;
  ggml_tensor *result;
  ggml_tensor *im2col;
  undefined4 in_stack_ffffffffffffff7c;
  undefined4 in_stack_ffffffffffffff84;
  undefined4 uVar3;
  undefined4 in_stack_ffffffffffffff9c;
  ggml_tensor *in_stack_ffffffffffffffa0;
  ggml_context *in_stack_ffffffffffffffb0;
  int64_t in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffd0;
  
  uVar3 = *in_RSI;
  pgVar1 = ggml_im2col(in_stack_00000020,
                       (ggml_tensor *)CONCAT44(in_stack_0000001c,in_stack_00000018),
                       (ggml_tensor *)CONCAT44(in_stack_00000014,in_stack_00000010),
                       in_stack_0000000c,in_stack_00000008,unaff_retaddr_00,in_stack_00000030,
                       in_stack_00000038,in_stack_00000040,unaff_retaddr,(ggml_type)im2col);
  pgVar2 = in_RDI;
  ctx_00 = ggml_reshape_2d(in_stack_ffffffffffffffb0,in_RDI,(int64_t)in_stack_ffffffffffffffa0,
                           CONCAT44(in_stack_ffffffffffffff9c,uVar3));
  ggml_reshape_2d((ggml_context *)ctx_00,pgVar2,(int64_t)in_stack_ffffffffffffffa0,
                  CONCAT44(in_stack_ffffffffffffff9c,uVar3));
  ne0 = ggml_mul_mat((ggml_context *)ctx_00,pgVar2,in_stack_ffffffffffffffa0);
  pgVar1 = ggml_reshape_4d((ggml_context *)CONCAT44(in_R9D,in_stack_ffffffffffffffd0),pgVar1,
                           (int64_t)ne0,in_stack_ffffffffffffffb8,(int64_t)ctx_00,(int64_t)pgVar2);
  ggml_permute((ggml_context *)pgVar1,in_RDI,(int)((ulong)ctx_00 >> 0x20),(int)ctx_00,
               (int)((ulong)pgVar2 >> 0x20),(int)pgVar2);
  pgVar2 = ggml_cont((ggml_context *)CONCAT44(in_stack_ffffffffffffff84,in_stack_00000010),
                     (ggml_tensor *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_00000008));
  return pgVar2;
}

Assistant:

struct ggml_tensor * ggml_conv_2d(
        struct ggml_context * ctx,
        struct ggml_tensor  * a,
        struct ggml_tensor  * b,
        int                   s0,
        int                   s1,
        int                   p0,
        int                   p1,
        int                   d0,
        int                   d1) {
    struct ggml_tensor * im2col = ggml_im2col(ctx, a, b, s0, s1, p0, p1, d0, d1, true, a->type); // [N, OH, OW, IC * KH * KW]

    struct ggml_tensor * result =
        ggml_mul_mat(ctx,
                ggml_reshape_2d(ctx, im2col, im2col->ne[0],  im2col->ne[3] * im2col->ne[2] * im2col->ne[1]), // [N, OH, OW, IC * KH * KW] => [N*OH*OW, IC * KH * KW]
                ggml_reshape_2d(ctx, a, (a->ne[0] * a->ne[1] * a->ne[2]),  a->ne[3]));                       // [OC，IC, KH, KW] => [OC, IC * KH * KW]

    result = ggml_reshape_4d(ctx, result, im2col->ne[1], im2col->ne[2], im2col->ne[3], a->ne[3]); // [OC, N, OH, OW]
    result = ggml_cont(ctx, ggml_permute(ctx, result, 0, 1, 3, 2)); // [N, OC, OH, OW]


    return result;
}